

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O1

QVariant * qDateFromString(QVariant *__return_storage_ptr__,QString *val)

{
  long lVar1;
  QDate QVar2;
  QStringView QVar3;
  
  lVar1 = (val->d).size;
  if (lVar1 == 0) {
    QVar2.jd = -0x8000000000000000;
  }
  else {
    QVar3.m_data = (val->d).ptr;
    QVar3.m_size = lVar1;
    QVar2.jd = QDate::fromString(QVar3,ISODate);
  }
  QVariant::QVariant(__return_storage_ptr__,QVar2);
  return __return_storage_ptr__;
}

Assistant:

static inline QVariant qDateFromString(const QString &val)
{
#if !QT_CONFIG(datestring)
    Q_UNUSED(val);
    return QVariant(val);
#else
    if (val.isEmpty())
        return QVariant(QDate());
    return QVariant(QDate::fromString(val, Qt::ISODate));
#endif
}